

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::getSubroutineIndex
          (FunctionalTest3_4 *this,GLuint program_id,GLchar *subroutine_name,bool use_program_query)

{
  char *pcVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  undefined7 in_register_00000009;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if ((int)CONCAT71(in_register_00000009,use_program_query) == 0) {
    GVar3 = (**(code **)(lVar4 + 0xa88))(program_id,0x8b31,subroutine_name);
    err = (**(code **)(lVar4 + 0x800))();
    pcVar1 = "glGetSubroutineIndex";
    iVar2 = 0xc98;
  }
  else {
    GVar3 = (**(code **)(lVar4 + 0x9a8))(program_id,0x92e8,subroutine_name);
    err = (**(code **)(lVar4 + 0x800))();
    pcVar1 = "glGetProgramResourceIndex";
    iVar2 = 0xc9d;
  }
  glu::checkError(err,pcVar1 + 2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,iVar2);
  if (GVar3 != 0xffffffff) {
    return GVar3;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Subroutine is not available",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0xca2);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GLuint FunctionalTest3_4::getSubroutineIndex(GLuint program_id, const glw::GLchar* subroutine_name,
											 bool use_program_query) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLuint				  index = -1;

	if (false == use_program_query)
	{
		index = gl.getSubroutineIndex(program_id, GL_VERTEX_SHADER, subroutine_name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetSubroutineIndex");
	}
	else
	{
		index = gl.getProgramResourceIndex(program_id, GL_VERTEX_SUBROUTINE, subroutine_name);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramResourceIndex");
	}

	if (GL_INVALID_INDEX == index)
	{
		TCU_FAIL("Subroutine is not available");
	}

	return index;
}